

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O1

string * minja::error_location_suffix(string *__return_storage_ptr__,string *source,size_t pos)

{
  pointer pcVar1;
  long lVar2;
  ostream *poVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  size_t sVar5;
  size_type sVar6;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  long lVar10;
  ostringstream out;
  undefined1 local_1e1;
  long *local_1e0;
  long local_1d8;
  long local_1d0 [2];
  size_t local_1c0;
  string *local_1b8;
  ulong local_1b0;
  long *local_1a8 [2];
  long local_198 [12];
  ios_base local_138 [264];
  
  pcVar1 = (source->_M_dataplus)._M_p;
  if (pos == 0) {
    uVar8 = 0;
  }
  else {
    sVar5 = 0;
    uVar8 = 0;
    do {
      uVar8 = uVar8 + (pcVar1[sVar5] == '\n');
      sVar5 = sVar5 + 1;
    } while (pos != sVar5);
  }
  if (source->_M_string_length == 0) {
    lVar10 = 0;
  }
  else {
    sVar6 = 0;
    lVar10 = 0;
    do {
      lVar10 = lVar10 + (ulong)(pcVar1[sVar6] == '\n');
      sVar6 = sVar6 + 1;
    } while (source->_M_string_length != sVar6);
  }
  local_1c0 = pos;
  local_1b8 = __return_storage_ptr__;
  local_1a8[0] = local_198;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)local_1a8,pcVar1,pcVar1 + pos);
  lVar2 = std::__cxx11::string::rfind((char)(string *)local_1a8,10);
  if (local_1a8[0] != local_198) {
    operator_delete(local_1a8[0],local_198[0] + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," at row ",8);
  uVar7 = uVar8 + 1;
  poVar3 = std::ostream::_M_insert<long>((long)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", column ",9);
  local_1c0 = local_1c0 - lVar2;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,":\n",2);
  if (0 < (long)uVar8) {
    pcVar9 = (source->_M_dataplus)._M_p;
    if (uVar8 != 1) {
      lVar2 = uVar8 - 1;
      do {
        local_1e1 = 10;
        _Var4 = std::
                __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                          (pcVar9,(source->_M_dataplus)._M_p + source->_M_string_length,&local_1e1);
        pcVar9 = _Var4._M_current + 1;
        lVar2 = lVar2 + -1;
      } while (lVar2 != 0);
    }
    local_1e1 = 10;
    _Var4 = std::
            __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (pcVar9,(source->_M_dataplus)._M_p + source->_M_string_length);
    local_1e0 = local_1d0;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)&local_1e0,pcVar9,_Var4._M_current);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_1e0,local_1d8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    if (local_1e0 != local_1d0) {
      operator_delete(local_1e0,local_1d0[0] + 1);
    }
  }
  pcVar9 = (source->_M_dataplus)._M_p;
  local_1b0 = uVar7;
  if (1 < uVar7) {
    uVar7 = uVar8;
    do {
      local_1e1 = 10;
      _Var4 = std::
              __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                        (pcVar9,(source->_M_dataplus)._M_p + source->_M_string_length,&local_1e1);
      pcVar9 = _Var4._M_current + 1;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  local_1e1 = 10;
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    (pcVar9,(source->_M_dataplus)._M_p + source->_M_string_length);
  local_1e0 = local_1d0;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)&local_1e0,pcVar9,_Var4._M_current);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(char *)local_1e0,local_1d8);
  uVar7 = local_1b0;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  if (local_1e0 != local_1d0) {
    operator_delete(local_1e0,local_1d0[0] + 1);
  }
  local_1e0 = local_1d0;
  std::__cxx11::string::_M_construct((ulong)&local_1e0,(char)local_1c0 + -1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(char *)local_1e0,local_1d8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"^\n",2);
  if (local_1e0 != local_1d0) {
    operator_delete(local_1e0,local_1d0[0] + 1);
  }
  if ((long)uVar8 < lVar10) {
    pcVar9 = (source->_M_dataplus)._M_p;
    if (uVar8 < 0xfffffffffffffffe) {
      do {
        local_1e1 = 10;
        _Var4 = std::
                __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                          (pcVar9,(source->_M_dataplus)._M_p + source->_M_string_length,&local_1e1);
        pcVar9 = _Var4._M_current + 1;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
    }
    local_1e1 = 10;
    _Var4 = std::
            __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (pcVar9,(source->_M_dataplus)._M_p + source->_M_string_length);
    local_1e0 = local_1d0;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)&local_1e0,pcVar9,_Var4._M_current);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_1e0,local_1d8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    if (local_1e0 != local_1d0) {
      operator_delete(local_1e0,local_1d0[0] + 1);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return local_1b8;
}

Assistant:

static std::string error_location_suffix(const std::string & source, size_t pos) {
  auto get_line = [&](size_t line) {
    auto start = source.begin();
    for (size_t i = 1; i < line; ++i) {
      start = std::find(start, source.end(), '\n') + 1;
    }
    auto end = std::find(start, source.end(), '\n');
    return std::string(start, end);
  };
  auto start = source.begin();
  auto end = source.end();
  auto it = start + pos;
  auto line = std::count(start, it, '\n') + 1;
  auto max_line = std::count(start, end, '\n') + 1;
  auto col = pos - std::string(start, it).rfind('\n');
  std::ostringstream out;
  out << " at row " << line << ", column " << col << ":\n";
  if (line > 1) out << get_line(line - 1) << "\n";
  out << get_line(line) << "\n";
  out << std::string(col - 1, ' ') << "^\n";
  if (line < max_line) out << get_line(line + 1) << "\n";

  return out.str();
}